

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osmesa_context.c
# Opt level: O2

int glfwGetOSMesaDepthBuffer
              (GLFWwindow *handle,int *width,int *height,int *bytesPerValue,void **buffer)

{
  int iVar1;
  char *format;
  GLint mesaBytes;
  GLint mesaHeight;
  GLint mesaWidth;
  void *mesaBuffer;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abhisarshukla[P]opengl-cmake-template/libs/glfw-3.3.4/src/osmesa_context.c"
                  ,0x14e,"int glfwGetOSMesaDepthBuffer(GLFWwindow *, int *, int *, int *, void **)")
    ;
  }
  if (_glfw.initialized == 0) {
    iVar1 = 0x10001;
    format = (char *)0x0;
  }
  else {
    iVar1 = (*_glfw.osmesa.GetDepthBuffer)
                      (*(OSMesaContext *)(handle + 0x2a0),&mesaWidth,&mesaHeight,&mesaBytes,
                       &mesaBuffer);
    if (iVar1 != 0) {
      if (width != (int *)0x0) {
        *width = mesaWidth;
      }
      if (height != (int *)0x0) {
        *height = mesaHeight;
      }
      if (bytesPerValue != (int *)0x0) {
        *bytesPerValue = mesaBytes;
      }
      if (buffer == (void **)0x0) {
        return 1;
      }
      *buffer = mesaBuffer;
      return 1;
    }
    format = "OSMesa: Failed to retrieve depth buffer";
    iVar1 = 0x10008;
  }
  _glfwInputError(iVar1,format);
  return 0;
}

Assistant:

GLFWAPI int glfwGetOSMesaDepthBuffer(GLFWwindow* handle,
                                     int* width, int* height,
                                     int* bytesPerValue,
                                     void** buffer)
{
    void* mesaBuffer;
    GLint mesaWidth, mesaHeight, mesaBytes;
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_FALSE);

    if (!OSMesaGetDepthBuffer(window->context.osmesa.handle,
                              &mesaWidth, &mesaHeight,
                              &mesaBytes, &mesaBuffer))
    {
        _glfwInputError(GLFW_PLATFORM_ERROR,
                        "OSMesa: Failed to retrieve depth buffer");
        return GLFW_FALSE;
    }

    if (width)
        *width = mesaWidth;
    if (height)
        *height = mesaHeight;
    if (bytesPerValue)
        *bytesPerValue = mesaBytes;
    if (buffer)
        *buffer = mesaBuffer;

    return GLFW_TRUE;
}